

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void ypr_text_squote_line(lys_ypr_ctx *pctx,char *text,int text_len)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  pcVar1 = text + text_len;
  if (text_len != 0) {
    iVar5 = (int)text;
    do {
      pcVar2 = ly_strnchr(text,0x27,(long)pcVar1 - (long)text);
      if (pcVar2 == (char *)0x0) break;
      uVar4 = 0;
      ly_print_((pctx->field_0).field_0.out,"%.*s",(ulong)(uint)((int)pcVar2 - (int)text),text);
      text = pcVar2;
      do {
        text = text + 1;
        if (text == pcVar1) {
          uVar4 = (ulong)(uint)((text_len + iVar5) - (int)pcVar2);
          break;
        }
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (*text == '\'');
      uVar3 = 0;
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
          (undefined1  [24])0x0) {
        uVar3 = (ulong)((uint)(pctx->field_0).field_0.level * 2);
      }
      ly_print_((pctx->field_0).field_0.out,"\' + \"%.*s\" +\n%*s\'",uVar4,pcVar2,uVar3,"");
    } while (text != pcVar1);
  }
  ly_print_((pctx->field_0).field_0.out,"%.*s",(ulong)(uint)((int)pcVar1 - (int)text),text);
  return;
}

Assistant:

static void
ypr_text_squote_line(struct lys_ypr_ctx *pctx, const char *text, int text_len)
{
    const char *end = text + text_len, *squote;
    int squote_len;

    while ((text != end) && (squote = ly_strnchr(text, '\'', end - text))) {
        /* before squote */
        ly_print_(pctx->out, "%.*s", (int)(squote - text), text);

        /* specially-encoded squote(s) */
        squote_len = 0;
        do {
            ++squote_len;
        } while ((squote + squote_len != end) && (squote[squote_len] == '\''));
        ly_print_(pctx->out, "' + \"%.*s\" +\n%*s'", squote_len, squote, INDENT);

        /* next iter */
        text = squote + squote_len;
    }

    ly_print_(pctx->out, "%.*s", (int)(end - text), text);
}